

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasattributer.hpp
# Opt level: O0

void __thiscall LASattributer::clean_attributes(LASattributer *this)

{
  LASattributer *this_local;
  
  if (((this->attributes_linked & 1U) != 0) && (this->attributes != (LASattribute *)0x0)) {
    this->number_attributes = 0;
    free(this->attributes);
    this->attributes = (LASattribute *)0x0;
    free(this->attribute_starts);
    this->attribute_starts = (I32 *)0x0;
    free(this->attribute_sizes);
    this->attribute_sizes = (I32 *)0x0;
  }
  return;
}

Assistant:

void clean_attributes() {
    if (attributes_linked) {
      if (attributes) {
        number_attributes = 0;
        free(attributes);
        attributes = 0;
        free(attribute_starts);
        attribute_starts = 0;
        free(attribute_sizes);
        attribute_sizes = 0;
      }
    }
  }